

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall duckdb::DataTable::SetTableName(DataTable *this,string *new_name)

{
  DataTableInfo *this_00;
  string sStack_38;
  
  this_00 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)new_name);
  DataTableInfo::SetTableName(this_00,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void DataTable::SetTableName(string new_name) {
	info->SetTableName(std::move(new_name));
}